

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O2

Sampler * vk::mapVkSampler(Sampler *__return_storage_ptr__,VkSamplerCreateInfo *samplerCreateInfo)

{
  VkFilter VVar1;
  VkBool32 VVar2;
  WrapMode WVar3;
  WrapMode WVar4;
  WrapMode WVar5;
  FilterMode FVar6;
  CompareMode CVar7;
  InternalError *this;
  VkFilter VVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  deUint32 dVar11;
  deUint32 dVar12;
  
  WVar3 = mapVkSamplerAddressMode(samplerCreateInfo->addressModeU);
  WVar4 = mapVkSamplerAddressMode(samplerCreateInfo->addressModeV);
  WVar5 = mapVkSamplerAddressMode(samplerCreateInfo->addressModeW);
  FVar6 = mapVkMinTexFilter(samplerCreateInfo->minFilter,samplerCreateInfo->mipmapMode);
  VVar1 = samplerCreateInfo->magFilter;
  VVar8 = 6;
  if (VVar1 == VK_FILTER_NEAREST) {
    VVar8 = VVar1;
  }
  VVar2 = samplerCreateInfo->unnormalizedCoordinates;
  if (VVar1 == VK_FILTER_LINEAR) {
    VVar8 = VVar1;
  }
  CVar7 = COMPAREMODE_NONE;
  if (samplerCreateInfo->compareEnable != 0) {
    CVar7 = mapVkSamplerCompareOp(samplerCreateInfo->compareOp);
  }
  __return_storage_ptr__->lodThreshold = 0.0;
  __return_storage_ptr__->wrapS = WVar3;
  __return_storage_ptr__->wrapT = WVar4;
  __return_storage_ptr__->wrapR = WVar5;
  __return_storage_ptr__->minFilter = FVar6;
  __return_storage_ptr__->magFilter = VVar8;
  __return_storage_ptr__->normalizedCoords = VVar2 == 0;
  __return_storage_ptr__->compare = CVar7;
  dVar9 = 0;
  dVar10 = 0;
  dVar11 = 0;
  dVar12 = 0;
  *(undefined8 *)&__return_storage_ptr__->compareChannel = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->borderColor).v + 4) = 0;
  (__return_storage_ptr__->borderColor).v.uData[3] = 0;
  __return_storage_ptr__->seamlessCubeMap = true;
  __return_storage_ptr__->depthStencilMode = MODE_DEPTH;
  if (samplerCreateInfo->anisotropyEnable == 0) {
    if (samplerCreateInfo->borderColor < VK_BORDER_COLOR_LAST) {
      switch(samplerCreateInfo->borderColor) {
      case VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK:
        (__return_storage_ptr__->borderColor).v.uData[1] = 0;
        (__return_storage_ptr__->borderColor).v.uData[3] = 0x3f800000;
        return __return_storage_ptr__;
      case VK_BORDER_COLOR_INT_OPAQUE_BLACK:
        (__return_storage_ptr__->borderColor).v.uData[1] = 0;
        (__return_storage_ptr__->borderColor).v.uData[3] = 1;
        return __return_storage_ptr__;
      case VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE:
        dVar9 = 0x3f800000;
        dVar10 = 0x3f800000;
        dVar11 = 0x3f800000;
        dVar12 = 0x3f800000;
        break;
      case VK_BORDER_COLOR_INT_OPAQUE_WHITE:
        dVar9 = 1;
        dVar10 = 1;
        dVar11 = 1;
        dVar12 = 1;
      }
      (__return_storage_ptr__->borderColor).v.uData[0] = dVar9;
      (__return_storage_ptr__->borderColor).v.uData[1] = dVar10;
      (__return_storage_ptr__->borderColor).v.uData[2] = dVar11;
      (__return_storage_ptr__->borderColor).v.uData[3] = dVar12;
      return __return_storage_ptr__;
    }
    return __return_storage_ptr__;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this,"Anisotropic filtering is not supported by tcu::Sampler",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkImageUtil.cpp"
             ,0x377);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::Sampler mapVkSampler (const VkSamplerCreateInfo& samplerCreateInfo)
{
	// \note minLod & maxLod are not supported by tcu::Sampler. LOD must be clamped
	//       before passing it to tcu::Texture*::sample*()

	tcu::Sampler sampler(mapVkSamplerAddressMode(samplerCreateInfo.addressModeU),
						 mapVkSamplerAddressMode(samplerCreateInfo.addressModeV),
						 mapVkSamplerAddressMode(samplerCreateInfo.addressModeW),
						 mapVkMinTexFilter(samplerCreateInfo.minFilter, samplerCreateInfo.mipmapMode),
						 mapVkMagTexFilter(samplerCreateInfo.magFilter),
						 0.0f,
						 !samplerCreateInfo.unnormalizedCoordinates,
						 samplerCreateInfo.compareEnable ? mapVkSamplerCompareOp(samplerCreateInfo.compareOp)
														 : tcu::Sampler::COMPAREMODE_NONE,
						 0,
						 tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f),
						 true);

	if (samplerCreateInfo.anisotropyEnable)
		TCU_THROW(InternalError, "Anisotropic filtering is not supported by tcu::Sampler");

	switch (samplerCreateInfo.borderColor)
	{
		case VK_BORDER_COLOR_INT_OPAQUE_BLACK:
			sampler.borderColor = tcu::UVec4(0,0,0,1);
			break;
		case VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK:
			sampler.borderColor = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);
			break;
		case VK_BORDER_COLOR_INT_OPAQUE_WHITE:
			sampler.borderColor = tcu::UVec4(1, 1, 1, 1);
			break;
		case VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE:
			sampler.borderColor = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);
			break;
		case VK_BORDER_COLOR_INT_TRANSPARENT_BLACK:
			sampler.borderColor = tcu::UVec4(0,0,0,0);
			break;
		case VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK:
			sampler.borderColor = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	return sampler;
}